

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_legacy_pool_policy::get
          (_legacy_pool_policy *this,service *param_2)

{
  reference ppaVar1;
  long in_RSI;
  application *in_RDI;
  intrusive_ptr<cppcms::application> *app;
  application *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint3 in_stack_ffffffffffffffe4;
  uint uVar2;
  
  uVar2 = (uint)in_stack_ffffffffffffffe4;
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)in_RDI);
  if (*(long *)(in_RSI + 0x40) != 0) {
    *(long *)(in_RSI + 0x40) = *(long *)(in_RSI + 0x40) + -1;
    *(long *)(in_RSI + 0x38) = *(long *)(in_RSI + 0x38) + -1;
    std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::operator[]
              ((vector<cppcms::application_*,_std::allocator<cppcms::application_*>_> *)
               (in_RSI + 0x18),*(size_type *)(in_RSI + 0x40));
    booster::intrusive_ptr<cppcms::application>::operator=
              ((intrusive_ptr<cppcms::application> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
    ppaVar1 = std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::operator[]
                        ((vector<cppcms::application_*,_std::allocator<cppcms::application_*>_> *)
                         (in_RSI + 0x18),*(size_type *)(in_RSI + 0x40));
    *ppaVar1 = (value_type)0x0;
  }
  return (intrusive_ptr<cppcms::application>)in_RDI;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &)
	{
		booster::intrusive_ptr<application> app;
		// must never happen start
		if(size_ == 0)
			return app;
		// must never happen end
		size_--;
		pending_--;
		app = apps_[size_];
		apps_[size_] = 0;
		return app;
	}